

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O3

void __thiscall
ReplayingHammerer::run_code_jitting_probing(ReplayingHammerer *this,PatternAddressMapper *mapper)

{
  bool sync_each_ref;
  int aggressors_for_sync;
  string *__k;
  iterator iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *args;
  uint num_activations;
  long lVar4;
  int local_98 [2];
  PatternAddressMapper *local_90;
  HammeringPattern *local_88;
  FuzzingParameterSet *local_80;
  CodeJitter *local_78;
  string local_70;
  string local_50;
  
  local_78 = PatternAddressMapper::get_code_jitter(mapper);
  local_90 = mapper;
  __k = PatternAddressMapper::get_instance_id_abi_cxx11_(mapper);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->map_mapping_id_to_pattern)._M_h,__k);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_88 = (HammeringPattern *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_true>
                      ._M_cur + 0x28);
    local_98[0]._0_2_ = 1;
    local_80 = &this->params;
    lVar4 = 0;
    do {
      sync_each_ref = *(bool *)((long)local_98 + lVar4);
      sVar2 = hammer_pattern(this,local_80,local_78,local_88,local_90,local_78->flushing_strategy,
                             local_78->fencing_strategy,(long)this->hammering_num_reps,
                             local_78->num_aggs_for_sync,local_78->total_activations,false,
                             sync_each_ref,false,false,false,true,true);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"sync_each_ref = %-8s => %d bit flips","");
      args = "false";
      if (sync_each_ref != false) {
        args = "true";
      }
      format_string<char_const*,unsigned_long>(&local_70,&local_50,args,sVar2);
      Logger::log_info(&local_70,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    local_98[0] = 1;
    local_98[1] = 2;
    lVar4 = 0;
    do {
      aggressors_for_sync = *(int *)((long)local_98 + lVar4);
      sVar2 = hammer_pattern(this,local_80,local_78,local_88,local_90,local_78->flushing_strategy,
                             local_78->fencing_strategy,(long)this->hammering_num_reps,
                             aggressors_for_sync,local_78->total_activations,false,
                             local_78->pattern_sync_each_ref,false,false,false,true,true);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"num_aggs_for_sync = %-7d => %d bit flips","");
      format_string<int,unsigned_long>(&local_70,&local_50,aggressors_for_sync,sVar2);
      Logger::log_info(&local_70,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + 4;
    } while (lVar4 != 8);
    num_activations = 11000000;
    do {
      num_activations = num_activations - 1000000;
      sVar2 = hammer_pattern(this,local_80,local_78,local_88,local_90,local_78->flushing_strategy,
                             local_78->fencing_strategy,(long)this->hammering_num_reps,
                             local_78->num_aggs_for_sync,num_activations,false,
                             local_78->pattern_sync_each_ref,false,false,false,true,true);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"total_num_acts_hammering = %-12d => %d bit flips","");
      format_string<int,unsigned_long>(&local_70,&local_50,num_activations,sVar2);
      Logger::log_info(&local_70,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (2000000 < num_activations);
    return;
  }
  uVar3 = std::__throw_out_of_range("_Map_base::at");
  _Unwind_Resume(uVar3);
}

Assistant:

[[maybe_unused]] void ReplayingHammerer::run_code_jitting_probing(PatternAddressMapper &mapper) {
  auto &cj = mapper.get_code_jitter();
  auto &patt = map_mapping_id_to_pattern.at(mapper.get_instance_id());

  // - FLUSHING_STRATEGY / FENCING_STRATEGY
//      for (const auto &ff_strategy : get_valid_strategies()) {
//        auto num_bit_flips = hammer_pattern(mem, params, jitter, patt, mapper, ff_strategy.first, ff_strategy.second,
//            hammering_num_reps, sync_each_ref, num_sync_aggs, total_acts, false, verbose_memcheck, verbose_params);
//        Logger::log_info(format_string("FLUSHING_STRATEGY = %-17s, FENCING_STRATEGY = %-19s => %d bit flips",
//            to_string(ff_strategy.first).c_str(), to_string(ff_strategy.second).c_str(), num_bit_flips));
//      }

  // - sync_each_ref
  for (auto &sync : {true, false}) {
    auto num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy,
        hammering_num_reps, cj.num_aggs_for_sync, cj.total_activations, false, sync, false, false, false,
        true, true);
    Logger::log_info(format_string("sync_each_ref = %-8s => %d bit flips",
        (sync ? "true" : "false"), num_bit_flips));
  }

  // - num_aggs_for_sync
  for (const auto &sync_aggs : {1, 2}) {
    auto num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy,
        hammering_num_reps, sync_aggs, cj.total_activations, false, cj.pattern_sync_each_ref, false, false,
        false, true, true);
    Logger::log_info(format_string("num_aggs_for_sync = %-7d => %d bit flips", sync_aggs, num_bit_flips));
  }

  // - hammering_total_num_activations
  for (int a = M(10); a > M(1); a -= M(1)) {
    auto num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy,
        hammering_num_reps, cj.num_aggs_for_sync, a, false, cj.pattern_sync_each_ref, false, false, false,
        true, true);
    Logger::log_info(format_string("total_num_acts_hammering = %-12d => %d bit flips", a, num_bit_flips));
  }
}